

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.hpp
# Opt level: O3

void __thiscall
foxxll::block_manager::
new_blocks<foxxll::random_cyclic,__gnu_cxx::__normal_iterator<foxxll::BID<0ul>*,std::vector<foxxll::BID<0ul>,std::allocator<foxxll::BID<0ul>>>>>
          (block_manager *this,random_cyclic *functor,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_begin,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_end,size_t alloc_offset)

{
  long *plVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  size_t sVar2;
  unsigned_long uVar3;
  value_type *ppdVar4;
  value_type pdVar5;
  size_t sVar6;
  ulong uVar7;
  iterator __position;
  size_type new_size;
  external_size_type eVar8;
  undefined1 auVar9 [16];
  void *__s;
  void *__s_00;
  value_type *pvVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  unsigned_long uVar14;
  long lVar15;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  _Var16;
  pointer pvVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  simple_vector<BIDType> bids;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  disk_out;
  unique_lock<std::mutex> lock;
  SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> local_88;
  ulong local_70;
  random_cyclic *local_68;
  size_t local_60;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_58;
  unique_lock<std::mutex> local_40;
  
  local_88.array_ = (value_type *)local_88.size_;
  local_40._M_device = &this->mutex_;
  local_40._M_owns = false;
  local_68 = functor;
  local_60 = alloc_offset;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  uVar13 = this->ndisks_;
  if (uVar13 == 0) {
    __s = (void *)0x0;
    __s_00 = (void *)0x0;
  }
  else {
    uVar18 = -(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8;
    __s = operator_new__(uVar18);
    __s_00 = operator_new__(uVar18);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_58,uVar13,(allocator_type *)&local_88);
  if (uVar13 != 0) {
    memset(__s,0,uVar13 << 3);
    memset(__s_00,0,uVar13 << 3);
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_88.array_;
  local_88 = (SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>)(auVar9 << 0x40);
  if ((long)bid_end._M_current - (long)bid_begin._M_current != 0) {
    local_70 = ((long)bid_end._M_current - (long)bid_begin._M_current >> 3) * -0x5555555555555555;
    uVar14 = 0;
    _Var16._M_current = bid_begin._M_current;
    do {
      sVar2 = (local_68->super_striping).begin_;
      uVar3 = (local_68->perm_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(local_60 + uVar14) % (local_68->super_striping).diff_];
      uVar13 = uVar3 + sVar2;
      ppdVar4 = (this->block_allocators_).array_;
      pdVar5 = ppdVar4[uVar13];
      sVar6 = (_Var16._M_current)->size;
      uVar18 = uVar13;
      if (((pdVar5->autogrow_ == false) &&
          (pdVar5->free_bytes_ < *(long *)((long)__s_00 + uVar13 * 8) + sVar6)) &&
         (uVar7 = this->ndisks_, 1 < uVar7)) {
        lVar15 = uVar7 - 1;
        uVar11 = sVar2 + uVar3;
        do {
          uVar11 = uVar11 + 1;
          uVar18 = uVar11 % uVar7;
          pdVar5 = ppdVar4[uVar18];
          if ((pdVar5->autogrow_ != false) ||
             (*(long *)((long)__s_00 + uVar18 * 8) + sVar6 <= pdVar5->free_bytes_)) break;
          lVar15 = lVar15 + -1;
          uVar18 = uVar13;
        } while (lVar15 != 0);
      }
      plVar1 = (long *)((long)__s + uVar18 * 8);
      *plVar1 = *plVar1 + 1;
      plVar1 = (long *)((long)__s_00 + uVar18 * 8);
      *plVar1 = *plVar1 + sVar6;
      this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                (local_58.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar18);
      __position._M_current = *(unsigned_long **)(this_00 + 8);
      if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(this_00,__position,&local_88.size_);
      }
      else {
        *__position._M_current = uVar14;
        *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
      }
      uVar14 = local_88.size_ + 1;
      local_88.size_ = uVar14;
      _Var16._M_current = _Var16._M_current + 1;
    } while (uVar14 < local_70);
  }
  local_88.size_ = 0;
  local_88.array_ = (value_type *)0x0;
  if (this->ndisks_ == 0) {
    uVar13 = this->current_allocation_;
    if (this->current_allocation_ < this->maximum_allocation_) {
      uVar13 = this->maximum_allocation_;
    }
    this->maximum_allocation_ = uVar13;
  }
  else {
    uVar13 = 0;
    do {
      new_size = *(size_type *)((long)__s + uVar13 * 8);
      if (new_size != 0) {
        tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::resize(&local_88,new_size);
        pvVar17 = local_58.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar13;
        if (*(long *)((long)__s + uVar13 * 8) != 0) {
          uVar18 = 0;
          pvVar10 = local_88.array_;
          do {
            uVar14 = (pvVar17->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar18];
            pvVar10->size = bid_begin._M_current[uVar14].size;
            eVar8 = bid_begin._M_current[uVar14].offset;
            pvVar10->storage = bid_begin._M_current[uVar14].storage;
            pvVar10->offset = eVar8;
            uVar18 = uVar18 + 1;
            pvVar10 = pvVar10 + 1;
          } while (uVar18 < *(ulong *)((long)__s + uVar13 * 8));
        }
        disk_block_allocator::new_blocks<foxxll::BID<0ul>*>
                  ((this->block_allocators_).array_[uVar13],local_88.array_,
                   local_88.array_ + local_88.size_);
        lVar15 = *(long *)((long)__s + uVar13 * 8);
        if (lVar15 != 0) {
          lVar12 = 0;
          pvVar10 = local_88.array_;
          do {
            pvVar10->storage = (this->disk_files_).array_[uVar13].ptr_;
            uVar14 = (pvVar17->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar12];
            bid_begin._M_current[uVar14].size = pvVar10->size;
            eVar8 = pvVar10->offset;
            bid_begin._M_current[uVar14].storage = pvVar10->storage;
            bid_begin._M_current[uVar14].offset = eVar8;
            sVar2 = pvVar10->size;
            auVar19._8_4_ = (int)sVar2;
            auVar19._0_8_ = sVar2;
            auVar19._12_4_ = (int)(sVar2 >> 0x20);
            this->total_allocation_ = sVar2 + this->total_allocation_;
            this->current_allocation_ = auVar19._8_8_ + this->current_allocation_;
            lVar12 = lVar12 + 1;
            pvVar10 = pvVar10 + 1;
          } while (lVar15 != lVar12);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < this->ndisks_);
    uVar13 = this->current_allocation_;
    if (this->current_allocation_ < this->maximum_allocation_) {
      uVar13 = this->maximum_allocation_;
    }
    this->maximum_allocation_ = uVar13;
    if (local_88.array_ != (value_type *)0x0) {
      operator_delete__(local_88.array_);
    }
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_58);
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void block_manager::new_blocks(
    const DiskAssignFunctor& functor,
    BIDIterator bid_begin, BIDIterator bid_end,
    size_t alloc_offset)
{
    std::unique_lock<std::mutex> lock(mutex_);

    using BIDType = typename std::iterator_traits<BIDIterator>::value_type;

    // choose disks for each block, sum up bytes allocated on a disk

    tlx::simple_vector<size_t> disk_blocks(ndisks_);
    tlx::simple_vector<uint64_t> disk_bytes(ndisks_);
    std::vector<std::vector<size_t> > disk_out(ndisks_);

    disk_blocks.fill(0);
    disk_bytes.fill(0);

    size_t bid_size = static_cast<size_t>(bid_end - bid_begin);

    BIDIterator bid = bid_begin;
    for (size_t i = 0; i < bid_size; ++i, ++bid)
    {
        size_t disk_id = functor(alloc_offset + i);

        if (!block_allocators_[disk_id]->has_available_space(
                disk_bytes[disk_id] + bid->size
            ))
        {
            // find disk (cyclically) that has enough free space for block

            for (size_t adv = 1; adv < ndisks_; ++adv)
            {
                size_t try_disk_id = (disk_id + adv) % ndisks_;
                if (block_allocators_[try_disk_id]->has_available_space(
                        disk_bytes[try_disk_id] + bid->size
                    ))
                {
                    disk_id = try_disk_id;
                    break;
                }
            }

            // if no disk has free space, pick first selected by functor
        }

        // assign block to disk
        disk_blocks[disk_id]++;
        disk_bytes[disk_id] += bid->size;
        disk_out[disk_id].push_back(i);
    }

    // allocate blocks on disks in sequence, then scatter blocks into output

    tlx::simple_vector<BIDType> bids;

    for (size_t d = 0; d < ndisks_; ++d)
    {
        if (disk_blocks[d] == 0) continue;
        bids.resize(disk_blocks[d]);

        std::vector<size_t>& bid_perm = disk_out[d];

        // collect bids from output (due to size field for BID<0>)
        for (size_t i = 0; i < disk_blocks[d]; ++i)
            bids[i] = bid_begin[bid_perm[i]];

        // let block_allocator fill in offset fields
        block_allocators_[d]->new_blocks(bids);

        // distributed bids back to output
        for (size_t i = 0; i < disk_blocks[d]; ++i) {
            bids[i].storage = disk_files_[d].get();

            TLX_LOGC(verbose_block_life_cycle) << "BLC:new    " << bids[i];
            bid_begin[bid_perm[i]] = bids[i];

            total_allocation_ += bids[i].size;
            current_allocation_ += bids[i].size;
        }
    }

    maximum_allocation_ = std::max(maximum_allocation_, current_allocation_);
}